

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  int iVar1;
  long lVar2;
  int remain_3;
  int iVar3;
  float *pfVar4;
  int remain_2;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  int remain_7;
  uchar uVar10;
  int iVar11;
  float *pfVar12;
  int remain;
  int remain_1;
  int iVar13;
  int iVar14;
  uchar *puVar15;
  
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      iVar1 = this->w;
      iVar6 = this->h;
      iVar5 = iVar1 * -3 + stride;
      iVar9 = 0;
      if (0 < iVar6) {
        iVar9 = iVar6;
      }
      iVar11 = 1;
      if (iVar5 == 0) {
        iVar9 = iVar11;
        iVar11 = iVar6;
      }
      pfVar8 = (float *)this->data;
      lVar2 = this->elemsize * this->cstep;
      pfVar7 = (float *)((long)pfVar8 + lVar2);
      pfVar4 = (float *)((long)pfVar8 + lVar2 * 2);
      puVar15 = pixels;
      for (iVar6 = 0; iVar3 = iVar11 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
        for (; 0 < iVar3; iVar3 = iVar3 + -1) {
          iVar13 = (int)*pfVar8;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          *puVar15 = (uchar)iVar13;
          iVar13 = (int)*pfVar7;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar15[1] = (uchar)iVar13;
          iVar13 = (int)*pfVar4;
          if ((int)*pfVar4 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar15[2] = (uchar)iVar13;
          puVar15 = puVar15 + 3;
          pfVar8 = pfVar8 + 1;
          pfVar7 = pfVar7 + 1;
          pfVar4 = pfVar4 + 1;
        }
        puVar15 = puVar15 + iVar5;
      }
    }
    if (type == 3) {
      iVar1 = this->w;
      iVar6 = this->h;
      iVar9 = 0;
      if (0 < iVar6) {
        iVar9 = iVar6;
      }
      iVar11 = stride - iVar1;
      iVar5 = 1;
      if (iVar11 == 0) {
        iVar9 = iVar5;
        iVar5 = iVar6;
      }
      pfVar7 = (float *)this->data;
      puVar15 = pixels;
      for (iVar6 = 0; iVar3 = iVar5 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
        for (; 0 < iVar3; iVar3 = iVar3 + -1) {
          iVar13 = (int)*pfVar7;
          if ((int)*pfVar7 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          *puVar15 = (uchar)iVar13;
          puVar15 = puVar15 + 1;
          pfVar7 = pfVar7 + 1;
        }
        puVar15 = puVar15 + iVar11;
      }
    }
    if ((type & 0xfffeU) != 4) {
      return;
    }
    iVar1 = this->w;
    iVar6 = this->h;
    iVar5 = 0;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    iVar3 = stride + iVar1 * -4;
    iVar11 = 1;
    if (iVar3 == 0) {
      iVar9 = iVar11;
      iVar11 = iVar6;
    }
    pfVar8 = (float *)this->data;
    lVar2 = this->elemsize * this->cstep;
    pfVar7 = (float *)((long)pfVar8 + lVar2);
    pfVar4 = (float *)((long)pfVar8 + lVar2 * 2);
    pfVar12 = (float *)(lVar2 * 3 + (long)pfVar8);
    for (iVar6 = 0; iVar13 = iVar11 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
      for (; 0 < iVar13; iVar13 = iVar13 + -1) {
        iVar14 = (int)*pfVar8;
        if ((int)*pfVar8 < 1) {
          iVar14 = iVar5;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        *pixels = (uchar)iVar14;
        iVar14 = (int)*pfVar7;
        if ((int)*pfVar7 < 1) {
          iVar14 = iVar5;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pixels[1] = (uchar)iVar14;
        iVar14 = (int)*pfVar4;
        if ((int)*pfVar4 < 1) {
          iVar14 = iVar5;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pixels[2] = (uchar)iVar14;
        iVar14 = (int)*pfVar12;
        if ((int)*pfVar12 < 1) {
          iVar14 = iVar5;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pixels[3] = (uchar)iVar14;
        pixels = pixels + 4;
        pfVar8 = pfVar8 + 1;
        pfVar7 = pfVar7 + 1;
        pfVar4 = pfVar4 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar3;
    }
    return;
  }
  switch(type) {
  case 0x40001:
switchD_0012ab9b_caseD_50002:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    iVar11 = stride + iVar1 * -4;
    iVar5 = 1;
    if (iVar11 == 0) {
      iVar9 = iVar5;
      iVar5 = iVar6;
    }
    pfVar8 = (float *)this->data;
    lVar2 = this->elemsize * this->cstep;
    pfVar7 = (float *)((long)pfVar8 + lVar2);
    pfVar4 = (float *)((long)pfVar8 + lVar2 * 2);
    for (iVar6 = 0; iVar3 = iVar5 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        iVar13 = (int)*pfVar8;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        *pixels = (uchar)iVar13;
        iVar13 = (int)*pfVar7;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[1] = (uchar)iVar13;
        iVar13 = (int)*pfVar4;
        if ((int)*pfVar4 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[2] = (uchar)iVar13;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar8 = pfVar8 + 1;
        pfVar7 = pfVar7 + 1;
        pfVar4 = pfVar4 + 1;
      }
      pixels = pixels + iVar11;
    }
    break;
  case 0x40002:
switchD_0012ab9b_caseD_50001:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    iVar11 = stride + iVar1 * -4;
    iVar5 = 1;
    if (iVar11 == 0) {
      iVar9 = iVar5;
      iVar5 = iVar6;
    }
    pfVar8 = (float *)this->data;
    lVar2 = this->elemsize * this->cstep;
    pfVar7 = (float *)((long)pfVar8 + lVar2);
    pfVar4 = (float *)((long)pfVar8 + lVar2 * 2);
    for (iVar6 = 0; iVar3 = iVar5 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        iVar13 = (int)*pfVar4;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        *pixels = (uchar)iVar13;
        iVar13 = (int)*pfVar7;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[1] = (uchar)iVar13;
        iVar13 = (int)*pfVar8;
        if ((int)*pfVar8 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[2] = (uchar)iVar13;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar8 = pfVar8 + 1;
        pfVar7 = pfVar7 + 1;
        pfVar4 = pfVar4 + 1;
      }
      pixels = pixels + iVar11;
    }
    break;
  case 0x40003:
switchD_0012ab9b_caseD_50003:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    iVar11 = stride + iVar1 * -4;
    iVar5 = 1;
    if (iVar11 == 0) {
      iVar9 = iVar5;
      iVar5 = iVar6;
    }
    pfVar7 = (float *)this->data;
    for (iVar6 = 0; iVar3 = iVar5 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        iVar13 = (int)*pfVar7;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        uVar10 = (uchar)iVar13;
        *pixels = uVar10;
        pixels[1] = uVar10;
        pixels[2] = uVar10;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
      }
      pixels = pixels + iVar11;
    }
    return;
  case 0x40004:
switchD_0012ad2e_caseD_40004:
    fprintf(_stderr,"unimplemented convert type %d");
    fputc(10,_stderr);
    return;
  case 0x40005:
switchD_0012ab9b_caseD_50004:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar9 = 0;
    if (0 < iVar6) {
      iVar9 = iVar6;
    }
    iVar11 = stride + iVar1 * -4;
    iVar5 = 1;
    if (iVar11 == 0) {
      iVar9 = iVar5;
      iVar5 = iVar6;
    }
    pfVar8 = (float *)this->data;
    lVar2 = this->elemsize * this->cstep;
    pfVar7 = (float *)((long)pfVar8 + lVar2);
    pfVar4 = (float *)((long)pfVar8 + lVar2 * 2);
    pfVar12 = (float *)(lVar2 * 3 + (long)pfVar8);
    for (iVar6 = 0; iVar3 = iVar5 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        iVar13 = (int)*pfVar4;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        *pixels = (uchar)iVar13;
        iVar13 = (int)*pfVar7;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[1] = (uchar)iVar13;
        iVar13 = (int)*pfVar8;
        if ((int)*pfVar8 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[2] = (uchar)iVar13;
        iVar13 = (int)*pfVar12;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pixels[3] = (uchar)iVar13;
        pixels = pixels + 4;
        pfVar8 = pfVar8 + 1;
        pfVar7 = pfVar7 + 1;
        pfVar4 = pfVar4 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar11;
    }
    return;
  default:
    switch(type) {
    case 0x50001:
      goto switchD_0012ab9b_caseD_50001;
    case 0x50002:
      goto switchD_0012ab9b_caseD_50002;
    case 0x50003:
      goto switchD_0012ab9b_caseD_50003;
    case 0x50004:
      goto switchD_0012ab9b_caseD_50004;
    default:
      if ((type == 0x20001) || (type == 0x10002)) {
        iVar1 = this->w;
        iVar6 = this->h;
        iVar5 = iVar1 * -3 + stride;
        iVar9 = 0;
        if (0 < iVar6) {
          iVar9 = iVar6;
        }
        iVar11 = 1;
        if (iVar5 == 0) {
          iVar9 = iVar11;
          iVar11 = iVar6;
        }
        pfVar8 = (float *)this->data;
        lVar2 = this->elemsize * this->cstep;
        pfVar7 = (float *)((long)pfVar8 + lVar2);
        pfVar4 = (float *)((long)pfVar8 + lVar2 * 2);
        for (iVar6 = 0; iVar3 = iVar11 * iVar1, iVar6 != iVar9; iVar6 = iVar6 + 1) {
          for (; 0 < iVar3; iVar3 = iVar3 + -1) {
            iVar13 = (int)*pfVar8;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pixels[2] = (uchar)iVar13;
            iVar13 = (int)*pfVar7;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pixels[1] = (uchar)iVar13;
            iVar13 = (int)*pfVar4;
            if ((int)*pfVar4 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            *pixels = (uchar)iVar13;
            pixels = pixels + 3;
            pfVar8 = pfVar8 + 1;
            pfVar7 = pfVar7 + 1;
            pfVar4 = pfVar4 + 1;
          }
          pixels = pixels + iVar5;
        }
        return;
      }
      goto switchD_0012ad2e_caseD_40004;
    }
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            to_gray2rgba(*this, pixels, stride);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            to_rgba2bgra(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            to_rgba(*this, pixels, stride);
    }
}